

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O1

void ELFIO::dump::notes(ostream *out,elfio *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  elfio *peVar2;
  __uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_> section;
  char cVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer puVar10;
  Elf_Word EVar11;
  pointer puVar12;
  string name;
  Elf_Word descsz;
  Elf_Word type;
  char *desc;
  note_section_accessor notes;
  string local_a8;
  Elf_Word local_88;
  Elf_Word local_84;
  pointer local_80;
  elfio *local_78;
  pointer local_70;
  char *local_68;
  note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> local_60;
  pointer local_38;
  
  peVar2 = (reader->sections).parent;
  puVar10 = (peVar2->sections_).
            super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (peVar2->sections_).
            super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  cVar3 = (char)out;
  local_78 = reader;
  if (puVar10 != puVar12) {
    paVar1 = &local_a8.field_2;
    local_80 = puVar12;
    do {
      iVar7 = (*((puVar10->_M_t).
                 super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                 super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                 super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[5])();
      if (iVar7 == 7) {
        note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
        note_section_accessor_template
                  (&local_60,local_78,
                   (puVar10->_M_t).
                   super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                   super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                   super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl);
        iVar7 = (int)((ulong)((long)local_60.note_start_positions.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_60.note_start_positions.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (iVar7 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"Note section (",0xe);
          local_70 = puVar10;
          (*((puVar10->_M_t).
             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
             super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[3])
                    (&local_a8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"    No Name         Data size  Description",0x2a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          EVar11 = 0;
          do {
            local_a8._M_string_length = 0;
            local_a8.field_2._M_local_buf[0] = '\0';
            local_a8._M_dataplus._M_p = (pointer)paVar1;
            bVar6 = note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
                    get_note(&local_60,EVar11,&local_84,&local_a8,&local_68,&local_88);
            sVar5 = local_a8._M_string_length;
            _Var4._M_p = local_a8._M_dataplus._M_p;
            if (bVar6) {
              strlen(local_a8._M_dataplus._M_p);
              std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)sVar5,(ulong)_Var4._M_p);
              note(out,EVar11,local_84,&local_a8,local_68,local_88);
              std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_a8._M_dataplus._M_p,
                              CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                       local_a8.field_2._M_local_buf[0]) + 1);
            }
            EVar11 = EVar11 + 1;
          } while (iVar7 + (uint)(iVar7 == 0) != EVar11);
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
          puVar10 = local_70;
          puVar12 = local_80;
          std::ostream::put(cVar3);
          std::ostream::flush();
        }
        if (local_60.note_start_positions.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.note_start_positions.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.note_start_positions.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.note_start_positions.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar12);
  }
  peVar2 = (local_78->segments).parent;
  uVar9 = (long)(peVar2->segments_).
                super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar2->segments_).
                super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar9 & 0x7fff8) != 0) {
    local_38 = (pointer)(ulong)((uint)uVar9 >> 3 & 0xffff);
    puVar10 = (pointer)0x0;
    do {
      section._M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
      super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl =
           (((local_78->segments).parent)->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)puVar10]._M_t.
           super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t;
      iVar7 = (*(*(_func_int ***)
                  section._M_t.
                  super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                  super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl)[3])
                        (section._M_t.
                         super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>
                         .super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl);
      if (iVar7 == 4) {
        local_80 = puVar10;
        note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
        note_section_accessor_template
                  ((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size> *
                   )&local_60,local_78,
                   (segment *)
                   section._M_t.
                   super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                   super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl);
        puVar10 = (pointer)((ulong)((long)local_60.note_start_positions.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_60.note_start_positions.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if ((int)puVar10 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"Note segment (",0xe);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"    No Name         Data size  Description",0x2a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          EVar11 = 0;
          local_70 = puVar10;
          do {
            local_a8._M_string_length = 0;
            local_a8.field_2._M_local_buf[0] = '\0';
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            bVar6 = note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
                    get_note((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>
                              *)&local_60,EVar11,&local_84,&local_a8,&local_68,&local_88);
            sVar5 = local_a8._M_string_length;
            _Var4._M_p = local_a8._M_dataplus._M_p;
            if (bVar6) {
              strlen(local_a8._M_dataplus._M_p);
              puVar10 = local_70;
              std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)sVar5,(ulong)_Var4._M_p);
              note(out,EVar11,local_84,&local_a8,local_68,local_88);
              std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,
                              CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                       local_a8.field_2._M_local_buf[0]) + 1);
            }
            EVar11 = EVar11 + 1;
          } while ((Elf_Word)puVar10 != EVar11);
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
        }
        puVar10 = local_80;
        if (local_60.note_start_positions.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.note_start_positions.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.note_start_positions.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.note_start_positions.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          puVar10 = local_80;
        }
      }
      puVar10 = (pointer)((long)&(puVar10->_M_t).
                                 super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                 .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl + 1);
    } while (puVar10 != local_38);
  }
  return;
}

Assistant:

static void notes( std::ostream& out, const elfio& reader )
    {
        for ( const auto& sec : reader.sections ) { // For all sections
            if ( SHT_NOTE == sec->get_type() ) {    // Look at notes
                note_section_accessor notes( reader, sec.get() );
                Elf_Word              no_notes = notes.get_notes_num();

                if ( no_notes == 0 )
                    continue;

                out << "Note section (" << sec->get_name() << ")" << std::endl
                    << "    No Name         Data size  Description"
                    << std::endl;
                for ( Elf_Word j = 0; j < no_notes; ++j ) { // For all notes
                    Elf_Word    type;
                    std::string name;
                    char*       desc;
                    Elf_Word    descsz;

                    if ( notes.get_note( j, type, name, desc, descsz ) ) {
                        // 'name' usually contains \0 at the end. Remove it
                        name = name.c_str();
                        note( out, j, type, name, desc, descsz );
                        out << std::endl;
                    }
                }

                out << std::endl;
            }
        }

        Elf_Half no = reader.segments.size();
        for ( Elf_Half i = 0; i < no; ++i ) { // For all segments
            segment* seg = reader.segments[i];
            if ( PT_NOTE == seg->get_type() ) { // Look at notes
                note_segment_accessor notes( reader, seg );
                Elf_Word              no_notes = notes.get_notes_num();

                if ( no_notes == 0 )
                    continue;

                out << "Note segment (" << i << ")" << std::endl
                    << "    No Name         Data size  Description"
                    << std::endl;
                for ( Elf_Word j = 0; j < no_notes; ++j ) { // For all notes
                    Elf_Word    type;
                    std::string name;
                    char*       desc;
                    Elf_Word    descsz;

                    if ( notes.get_note( j, type, name, desc, descsz ) ) {
                        // 'name' usually contains \0 at the end. Remove it
                        name = name.c_str();
                        note( out, j, type, name, desc, descsz );
                        out << std::endl;
                    }
                }

                out << std::endl;
            }
        }
    }